

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool bVar1;
  bool bVar2;
  undefined1 *puVar3;
  Value *pVVar4;
  CharReader *pCVar5;
  Value *pVVar6;
  OurFeatures local_30;
  
  pVVar6 = &this->settings_;
  puVar3 = (undefined1 *)Value::find(pVVar6,"collectComments","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  bVar1 = Value::asBool((Value *)puVar3);
  local_30.allowComments_ = false;
  local_30.strictRoot_ = false;
  local_30.allowDroppedNullPlaceholders_ = false;
  local_30.allowNumericKeys_ = false;
  local_30.allowSingleQuotes_ = false;
  local_30.failIfExtra_ = false;
  local_30.rejectDupKeys_ = false;
  local_30.allowSpecialFloats_ = false;
  local_30.stackLimit_ = 0;
  puVar3 = (undefined1 *)Value::find(pVVar6,"allowComments","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar3);
  local_30.allowComments_ = bVar2;
  puVar3 = (undefined1 *)Value::find(pVVar6,"strictRoot","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar3);
  local_30.strictRoot_ = bVar2;
  puVar3 = (undefined1 *)Value::find(pVVar6,"allowDroppedNullPlaceholders","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar3);
  local_30.allowDroppedNullPlaceholders_ = bVar2;
  puVar3 = (undefined1 *)Value::find(pVVar6,"allowNumericKeys","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar3);
  local_30.allowNumericKeys_ = bVar2;
  puVar3 = (undefined1 *)Value::find(pVVar6,"allowSingleQuotes","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar3);
  local_30.allowSingleQuotes_ = bVar2;
  puVar3 = (undefined1 *)Value::find(pVVar6,"stackLimit","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  local_30.stackLimit_ = Value::asInt((Value *)puVar3);
  puVar3 = (undefined1 *)Value::find(pVVar6,"failIfExtra","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar3);
  local_30.failIfExtra_ = bVar2;
  puVar3 = (undefined1 *)Value::find(pVVar6,"rejectDupKeys","");
  if ((Value *)puVar3 == (Value *)0x0) {
    puVar3 = kNull;
  }
  bVar2 = Value::asBool((Value *)puVar3);
  local_30.rejectDupKeys_ = bVar2;
  pVVar4 = Value::find(pVVar6,"allowSpecialFloats","");
  pVVar6 = (Value *)kNull;
  if (pVVar4 != (Value *)0x0) {
    pVVar6 = pVVar4;
  }
  bVar2 = Value::asBool(pVVar6);
  local_30.allowSpecialFloats_ = bVar2;
  pCVar5 = (CharReader *)operator_new(0x130);
  pCVar5->_vptr_CharReader = (_func_int **)&PTR__OurCharReader_0012dcd0;
  *(bool *)&pCVar5[1]._vptr_CharReader = bVar1;
  OurReader::OurReader((OurReader *)(pCVar5 + 2),&local_30);
  return pCVar5;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const
{
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ = settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();
  features.stackLimit_ = settings_["stackLimit"].asInt();
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  return new OurCharReader(collectComments, features);
}